

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic_l1_fs.c
# Opt level: O1

int picnic_l1_fs_validate_keypair(picnic_l1_fs_privatekey_t *sk,picnic_l1_fs_publickey_t *pk)

{
  picnic_instance_t *lowmc;
  ulong uVar1;
  ulong uVar2;
  uint uVar3;
  uint8_t buffer [32];
  mzd_local_t ciphertext [1];
  mzd_local_t privkey [1];
  mzd_local_t plaintext [1];
  undefined8 local_e0;
  undefined8 local_d8;
  mzd_local_t local_c0;
  mzd_local_t local_a0;
  mzd_local_t local_80 [2];
  
  uVar3 = 0xffffffff;
  if (((pk != (picnic_l1_fs_publickey_t *)0x0 && sk != (picnic_l1_fs_privatekey_t *)0x0) &&
      (lowmc = picnic_instance_get(Picnic_L1_FS),
      *(undefined1 (*) [16])(sk->data + 0x20) == *(undefined1 (*) [16])(pk->data + 0x10))) &&
     (*(undefined1 (*) [16])(sk->data + 0x10) == *(undefined1 (*) [16])pk->data)) {
    mzd_from_char_array(local_80,sk->data + 0x20,0x10);
    mzd_from_char_array(&local_a0,sk->data,0x10);
    lowmc_compute(&lowmc->lowmc,&local_a0,local_80,&local_c0);
    mzd_to_char_array((uint8_t *)&local_e0,&local_c0,0x10);
    uVar1 = swap_bytes(local_e0);
    uVar2 = swap_bytes(*(undefined8 *)pk->data);
    if (uVar1 == uVar2) {
      uVar1 = swap_bytes(local_d8);
      uVar2 = swap_bytes(*(undefined8 *)(pk->data + 8));
      if (uVar1 == uVar2) {
        return 0;
      }
    }
    uVar3 = -(uint)(uVar1 < uVar2) | 1;
  }
  return uVar3;
}

Assistant:

int PICNIC_CALLING_CONVENTION picnic_l1_fs_validate_keypair(const picnic_l1_fs_privatekey_t* sk,
                                                            const picnic_l1_fs_publickey_t* pk) {
  if (!sk || !pk) {
    return -1;
  }

  const picnic_instance_t* instance = picnic_instance_get(PARAM);

  const uint8_t* sk_sk = SK_SK(sk);
  const uint8_t* sk_pt = SK_PT(sk);
  const uint8_t* sk_c  = SK_C(sk);
  const uint8_t* pk_pt = PK_PT(pk);
  const uint8_t* pk_c  = PK_C(pk);

  // check param and plaintext
  if (memcmp(sk_pt, pk_pt, LOWMC_BLOCK_SZ) != 0 || memcmp(sk_c, pk_c, LOWMC_BLOCK_SZ) != 0) {
    return -1;
  }

  mzd_local_t plaintext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t privkey[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];
  mzd_local_t ciphertext[(MAX_LOWMC_BLOCK_SIZE_BITS + 255) / 256];

  mzd_from_char_array(plaintext, sk_pt, LOWMC_BLOCK_SZ);
  mzd_from_char_array(privkey, sk_sk, LOWMC_BLOCK_SZ);

  // compute public key
  lowmc_compute(&instance->lowmc, privkey, plaintext, ciphertext);

  uint8_t buffer[MAX_LOWMC_BLOCK_SIZE];
  mzd_to_char_array(buffer, ciphertext, LOWMC_BLOCK_SZ);

  return memcmp(buffer, pk_c, LOWMC_BLOCK_SZ);
}